

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O2

void __thiscall catalog::catalog(catalog *this)

{
  pointer *ppuVar1;
  long lVar2;
  ostream *poVar3;
  TableInfo *this_00;
  void *pvVar4;
  int *piVar5;
  int iVar6;
  bool state;
  TableInfo *tableInfo;
  size_t size;
  int constraint;
  int local_4e8;
  int type;
  vector<TableInfo_*,_std::allocator<TableInfo_*>_> *local_4e0;
  catalog *local_4d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_4d0;
  int *local_4c8;
  size_t len_1;
  string indexName;
  size_t len;
  size_t pos;
  string attributeName;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> p;
  ifstream tablelist;
  ifstream IndexNamelist;
  
  local_4e0 = &this->TableInfoList;
  local_4d0 = &this->file_offset;
  this->anychangeornot = false;
  *(undefined8 *)&this->tableNumber = 0;
  *(undefined8 *)
   ((long)&(this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->file_offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->file_offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined4 *)
   ((long)&(this->file_offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  local_4d8 = this;
  std::ifstream::ifstream(&tablelist,"./file/catalog/table.dat",_S_in|_S_bin);
  std::ifstream::ifstream(&IndexNamelist,"./file/IndexNamelist.dat",_S_in|_S_bin);
  std::istream::seekg((long)&tablelist,_S_beg);
  lVar2 = std::istream::tellg();
  if (lVar2 != 0) {
    std::istream::seekg((long)&tablelist,_S_beg);
    piVar5 = &local_4d8->tableNumber;
    std::istream::read((char *)&tablelist,(long)piVar5);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,*piVar5);
    poVar3 = std::operator<<(poVar3," tables in total");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar6 = 0;
    local_4c8 = piVar5;
    while (iVar6 < *piVar5) {
      pos = std::istream::tellg();
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(local_4d0,&pos);
      std::istream::read((char *)&tablelist,(long)&state);
      std::istream::read((char *)&tablelist,(long)&len);
      if (state == false) {
        poVar3 = std::operator<<((ostream *)&std::cout,"find deleted table");
        std::endl<char,std::char_traits<char>>(poVar3);
        std::istream::seekg((long)&tablelist,(_Ios_Seekdir)len);
        std::istream::tellg();
        poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
        std::endl<char,std::char_traits<char>>(poVar3);
        ppuVar1 = &(local_4d8->file_offset).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + -1;
      }
      else {
        this_00 = (TableInfo *)operator_new(0xd8);
        TableInfo::TableInfo(this_00);
        tableInfo = this_00;
        std::istream::read((char *)&tablelist,(long)&size);
        pvVar4 = operator_new__(size + 1);
        std::istream::read((char *)&tablelist,(long)pvVar4);
        *(undefined1 *)((long)pvVar4 + size) = 0;
        std::__cxx11::string::assign((char *)tableInfo);
        std::istream::read((char *)&tablelist,(long)&tableInfo->attributeNum);
        local_4e8 = iVar6 + 1;
        for (iVar6 = 0; iVar6 < tableInfo->attributeNum; iVar6 = iVar6 + 1) {
          attributeName._M_dataplus._M_p = (pointer)&attributeName.field_2;
          attributeName._M_string_length = 0;
          attributeName.field_2._M_local_buf[0] = '\0';
          std::istream::read((char *)&tablelist,(long)&size);
          pvVar4 = operator_new__(size + 1);
          std::istream::read((char *)&tablelist,(long)pvVar4);
          *(undefined1 *)((long)pvVar4 + size) = 0;
          std::__cxx11::string::assign((char *)&attributeName);
          std::istream::read((char *)&tablelist,(long)&type);
          std::istream::read((char *)&tablelist,(long)&constraint);
          if (constraint - 3U < 2) {
            if (constraint == 3) {
              tableInfo->primary_key_id = iVar6;
            }
            indexName._M_dataplus._M_p = (pointer)&indexName.field_2;
            indexName._M_string_length = 0;
            indexName.field_2._M_local_buf[0] = '\0';
            std::istream::read((char *)&tablelist,(long)&len_1);
            pvVar4 = operator_new__(len_1 + 1);
            std::istream::read((char *)&tablelist,(long)pvVar4);
            *(undefined1 *)((long)pvVar4 + size) = 0;
            std::__cxx11::string::assign((char *)&indexName);
            p.first._M_dataplus._M_p._0_4_ = iVar6;
            std::__cxx11::string::string((string *)&p.first._M_string_length,(string *)&indexName);
            std::
            _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<int,std::__cxx11::string>&>
                      ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                        *)&tableInfo->indexInfo,
                       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&p);
            std::__cxx11::string::~string((string *)&p.first._M_string_length);
            std::__cxx11::string::~string((string *)&indexName);
          }
          std::vector<int,_std::allocator<int>_>::push_back(&tableInfo->type,&type);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&tableInfo->attributeName,&attributeName);
          std::vector<int,_std::allocator<int>_>::push_back(&tableInfo->constraint,&constraint);
          std::__cxx11::string::string((string *)&p,(string *)&attributeName);
          p.second = iVar6;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,int>&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)&tableInfo->getID,&p);
          std::__cxx11::string::~string((string *)&p);
          std::__cxx11::string::~string((string *)&attributeName);
        }
        std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::push_back(local_4e0,&tableInfo);
        iVar6 = local_4e8;
        poVar3 = std::operator<<((ostream *)&std::cout,"load table :");
        poVar3 = std::operator<<(poVar3,(string *)tableInfo);
        std::endl<char,std::char_traits<char>>(poVar3);
        piVar5 = local_4c8;
      }
    }
    std::ifstream::close();
    std::ifstream::close();
  }
  std::ifstream::~ifstream(&IndexNamelist);
  std::ifstream::~ifstream(&tablelist);
  return;
}

Assistant:

catalog::catalog(){
    tableNumber = 0;
    anychangeornot = false;
    std::ifstream tablelist("./file/catalog/table.dat", std::ios::in | std::ios::binary);
    std::ifstream IndexNamelist("./file/IndexNamelist.dat", std::ios::in | std::ios::binary);
    tablelist.seekg(0,std::ios::end); 
    // std::cout << tablelist.tellg() << std::endl;
    if(tablelist.tellg() == 0){
        return;//文件为空
    }
    else{
        tablelist.seekg(0,std::ios::beg);
        tablelist.read((char*)(&tableNumber),sizeof(int));
        std::cout<<tableNumber<<" tables in total"<<std::endl;
        int i = 0;
        while(i < tableNumber){
            //usleep(1*1000000);
            size_t pos = tablelist.tellg();
            //std::cout << "offset "<<pos<<std::endl;
            file_offset.push_back(pos);
            bool state;
            tablelist.read((char*)(&state),sizeof(bool));
            //std::cout<<state<<std::endl; 
            size_t len;
            tablelist.read((char*)(&len),sizeof(len));
            if(!state){
               std::cout<<"find deleted table"<<std::endl;
                tablelist.seekg(len,std::ios::cur);//跳过被删除的table
                std::cout<<tablelist.tellg()<<std::endl;//跳过被删除的table
                file_offset.pop_back();
                continue;
            }
            i++;
            TableInfo* tableInfo = new TableInfo();
            size_t size;
            //读入table的名字
            tablelist.read((char*)(&size),sizeof(size));
            char* buf = new char[size+1];
            tablelist.read(buf, size);
            buf[size] = '\0';
            tableInfo->tableName = buf;
            //读入colunm的数目
            tablelist.read((char*)(&(tableInfo->attributeNum)),sizeof(int));
            //读入列的信息
            for(int j = 0 ; j < tableInfo->attributeNum ; j ++){
                std::string attributeName;
                int type;
                int constraint;
                //
                tablelist.read((char*)(&size),sizeof(size));
                buf = new char[size+1];
                tablelist.read(buf, size);
                buf[size] = '\0';
                attributeName = buf;
                tablelist.read((char*)(&type),sizeof(int));
                tablelist.read((char*)(&constraint),sizeof(int));
                if(constraint == 4 || constraint == 3){
                    if(constraint == 3)tableInfo->primary_key_id = j;
                    //添加index信息
                    std::string indexName;
                    size_t len;
                    tablelist.read((char*)(&len),sizeof(len));
                    buf = new char[len+1];
                    tablelist.read(buf,len);
                    buf[size] = '\0';
                    indexName = buf;
                    std::pair<int,std::string> p = std::make_pair(j, indexName);
                    // tableInfo->indexInfo.push_back(p);
                    tableInfo->indexInfo.insert(p);  
                }
                tableInfo->type.push_back(type);
                tableInfo->attributeName.push_back(attributeName);
                tableInfo->constraint.push_back(constraint);
                std::pair<std::string,int> p = std::make_pair(attributeName,j);
                tableInfo->getID.insert(p); 
            }
            TableInfoList.push_back(tableInfo);//推入tablenfolist中
            std::cout<<"load table :"<<tableInfo->tableName<<std::endl;
        }
    }
    IndexNamelist.close();
    tablelist.close();
}